

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

bool __thiscall
RegVmLoweredFunction::TransferRegisterTo(RegVmLoweredFunction *this,VmValue *value,uchar reg)

{
  SmallArray<unsigned_char,_8U> *pSVar1;
  unsigned_short *puVar2;
  uint uVar3;
  VmValue **ppVVar4;
  VmValue **ppVVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if (value == (VmValue *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0xe3,"bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
  }
  uVar8 = (ulong)(value->users).count;
  if (uVar8 == 0) {
LAB_002702ec:
    uVar3 = (this->constantRegisters).count;
    if ((ulong)uVar3 != 0) {
      puVar6 = (this->constantRegisters).data;
      uVar8 = 0;
      do {
        if (puVar6[uVar8] == reg) {
          if ((this->registerUsers).data[reg] != 1) {
            __assert_fail("registerUsers[reg] == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                          ,0xec,
                          "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)")
            ;
          }
          puVar6[uVar8] = puVar6[uVar3 - 1];
          uVar3 = (this->constantRegisters).count;
          if (uVar3 == 0) goto LAB_0027052a;
          (this->constantRegisters).count = uVar3 - 1;
          pSVar1 = (SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2);
          uVar3 = *(uint *)(value[1].users.little + 3);
          if (uVar3 == *(uint *)((long)value[1].users.little + 0x1c)) {
            SmallArray<unsigned_char,_8U>::grow(pSVar1,uVar3);
          }
          puVar6 = pSVar1->data;
          if (puVar6 != (uchar *)0x0) {
            uVar3 = *(uint *)(value[1].users.little + 3);
            *(uint *)(value[1].users.little + 3) = uVar3 + 1;
            puVar6[uVar3] = reg;
            return true;
          }
          goto LAB_00270549;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar3 = (this->delayedFreedRegisters).count;
    if ((ulong)uVar3 != 0) {
      puVar6 = (this->delayedFreedRegisters).data;
      uVar8 = 0;
      do {
        if (puVar6[uVar8] == reg) {
          if ((this->registerUsers).data[reg] != 0) {
            __assert_fail("registerUsers[reg] == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                          ,0xfb,
                          "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)")
            ;
          }
          puVar6[uVar8] = puVar6[uVar3 - 1];
          uVar3 = (this->delayedFreedRegisters).count;
          if (uVar3 == 0) goto LAB_0027052a;
          (this->delayedFreedRegisters).count = uVar3 - 1;
          pSVar1 = (SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2);
          uVar3 = *(uint *)(value[1].users.little + 3);
          if (uVar3 == *(uint *)((long)value[1].users.little + 0x1c)) {
            SmallArray<unsigned_char,_8U>::grow(pSVar1,uVar3);
          }
          puVar6 = pSVar1->data;
          if (puVar6 != (uchar *)0x0) {
            uVar3 = *(uint *)(value[1].users.little + 3);
            *(uint *)(value[1].users.little + 3) = uVar3 + 1;
            puVar6[uVar3] = reg;
            puVar2 = (this->registerUsers).data + reg;
            *puVar2 = *puVar2 + 1;
            return true;
          }
          goto LAB_00270549;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar3 = (this->freedRegisters).count;
    uVar8 = (ulong)uVar3;
    bVar10 = uVar8 != 0;
    if (bVar10) {
      puVar6 = (this->freedRegisters).data;
      if (*puVar6 == reg) {
        uVar9 = 0;
      }
      else {
        uVar7 = 1;
        do {
          uVar9 = uVar7;
          if (uVar8 == uVar9) {
            return uVar9 < uVar8;
          }
          uVar7 = uVar9 + 1;
        } while (puVar6[uVar9] != reg);
        bVar10 = uVar9 < uVar8;
      }
      if ((this->registerUsers).data[reg] != 0) {
        __assert_fail("registerUsers[reg] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x10c,
                      "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
      }
      puVar6[uVar9] = puVar6[uVar3 - 1];
      uVar3 = (this->freedRegisters).count;
      if (uVar3 == 0) {
LAB_0027052a:
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x183,
                      "void SmallArray<unsigned char, 16>::pop_back() [T = unsigned char, N = 16]");
      }
      (this->freedRegisters).count = uVar3 - 1;
      pSVar1 = (SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2);
      uVar3 = *(uint *)(value[1].users.little + 3);
      if (uVar3 == *(uint *)((long)value[1].users.little + 0x1c)) {
        SmallArray<unsigned_char,_8U>::grow(pSVar1,uVar3);
      }
      puVar6 = pSVar1->data;
      if (puVar6 == (uchar *)0x0) {
LAB_00270549:
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<unsigned char, 8>::push_back(const T &) [T = unsigned char, N = 8]"
                     );
      }
      uVar3 = *(uint *)(value[1].users.little + 3);
      *(uint *)(value[1].users.little + 3) = uVar3 + 1;
      puVar6[uVar3] = reg;
      puVar2 = (this->registerUsers).data + reg;
      *puVar2 = *puVar2 + 1;
    }
  }
  else {
    ppVVar4 = (value->users).data;
    ppVVar5 = value[1].users.data;
    if (ppVVar5 == (*ppVVar4)[1].users.data) {
      uVar7 = 1;
      do {
        uVar9 = uVar7;
        if (uVar8 == uVar9) break;
        uVar7 = uVar9 + 1;
      } while (ppVVar5 == ppVVar4[uVar9][1].users.data);
      if (uVar8 <= uVar9) goto LAB_002702ec;
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool RegVmLoweredFunction::TransferRegisterTo(VmValue *value, unsigned char reg)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	assert(instruction);

	if(IsNonLocalValue(instruction))
		return false;

	for(unsigned i = 0; i < constantRegisters.size(); i++)
	{
		if(constantRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 1);

			constantRegisters[i] = constantRegisters.back();
			constantRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			return true;
		}
	}

	for(unsigned i = 0; i < delayedFreedRegisters.size(); i++)
	{
		if(delayedFreedRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 0);

			delayedFreedRegisters[i] = delayedFreedRegisters.back();
			delayedFreedRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			registerUsers[reg]++;

			return true;
		}
	}

	for(unsigned i = 0; i < freedRegisters.size(); i++)
	{
		if(freedRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 0);

			freedRegisters[i] = freedRegisters.back();
			freedRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			registerUsers[reg]++;

			return true;
		}
	}

	return false;
}